

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void pnga_scan_copy(Integer g_src,Integer g_dst,Integer g_msk,Integer lo,Integer hi)

{
  double *pdVar1;
  float *pfVar2;
  logical lVar3;
  long in_RCX;
  Integer in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  DoubleComplex last_val_48;
  DoubleComplex *msk_48;
  DoubleComplex *dst_48;
  DoubleComplex *src_48;
  SingleComplex last_val_47;
  DoubleComplex *msk_47;
  SingleComplex *dst_47;
  SingleComplex *src_47;
  double last_val_46;
  DoubleComplex *msk_46;
  double *dst_46;
  double *src_46;
  float last_val_45;
  DoubleComplex *msk_45;
  float *dst_45;
  float *src_45;
  longlong last_val_44;
  DoubleComplex *msk_44;
  longlong *dst_44;
  longlong *src_44;
  long last_val_43;
  DoubleComplex *msk_43;
  long *dst_43;
  long *src_43;
  int last_val_42;
  DoubleComplex *msk_42;
  int *dst_42;
  int *src_42;
  DoubleComplex last_val_41;
  SingleComplex *msk_41;
  DoubleComplex *dst_41;
  DoubleComplex *src_41;
  SingleComplex last_val_40;
  SingleComplex *msk_40;
  SingleComplex *dst_40;
  SingleComplex *src_40;
  double last_val_39;
  SingleComplex *msk_39;
  double *dst_39;
  double *src_39;
  float last_val_38;
  SingleComplex *msk_38;
  float *dst_38;
  float *src_38;
  longlong last_val_37;
  SingleComplex *msk_37;
  longlong *dst_37;
  longlong *src_37;
  long last_val_36;
  SingleComplex *msk_36;
  long *dst_36;
  long *src_36;
  int last_val_35;
  SingleComplex *msk_35;
  int *dst_35;
  int *src_35;
  DoubleComplex last_val_34;
  double *msk_34;
  DoubleComplex *dst_34;
  DoubleComplex *src_34;
  SingleComplex last_val_33;
  double *msk_33;
  SingleComplex *dst_33;
  SingleComplex *src_33;
  double last_val_32;
  double *msk_32;
  double *dst_32;
  double *src_32;
  float last_val_31;
  double *msk_31;
  float *dst_31;
  float *src_31;
  longlong last_val_30;
  double *msk_30;
  longlong *dst_30;
  longlong *src_30;
  long last_val_29;
  double *msk_29;
  long *dst_29;
  long *src_29;
  int last_val_28;
  double *msk_28;
  int *dst_28;
  int *src_28;
  DoubleComplex last_val_27;
  float *msk_27;
  DoubleComplex *dst_27;
  DoubleComplex *src_27;
  SingleComplex last_val_26;
  float *msk_26;
  SingleComplex *dst_26;
  SingleComplex *src_26;
  double last_val_25;
  float *msk_25;
  double *dst_25;
  double *src_25;
  float last_val_24;
  float *msk_24;
  float *dst_24;
  float *src_24;
  longlong last_val_23;
  float *msk_23;
  longlong *dst_23;
  longlong *src_23;
  long last_val_22;
  float *msk_22;
  long *dst_22;
  long *src_22;
  int last_val_21;
  float *msk_21;
  int *dst_21;
  int *src_21;
  DoubleComplex last_val_20;
  longlong *msk_20;
  DoubleComplex *dst_20;
  DoubleComplex *src_20;
  SingleComplex last_val_19;
  longlong *msk_19;
  SingleComplex *dst_19;
  SingleComplex *src_19;
  double last_val_18;
  longlong *msk_18;
  double *dst_18;
  double *src_18;
  float last_val_17;
  longlong *msk_17;
  float *dst_17;
  float *src_17;
  longlong last_val_16;
  longlong *msk_16;
  longlong *dst_16;
  longlong *src_16;
  long last_val_15;
  longlong *msk_15;
  long *dst_15;
  long *src_15;
  int last_val_14;
  longlong *msk_14;
  int *dst_14;
  int *src_14;
  DoubleComplex last_val_13;
  long *msk_13;
  DoubleComplex *dst_13;
  DoubleComplex *src_13;
  SingleComplex last_val_12;
  long *msk_12;
  SingleComplex *dst_12;
  SingleComplex *src_12;
  double last_val_11;
  long *msk_11;
  double *dst_11;
  double *src_11;
  float last_val_10;
  long *msk_10;
  float *dst_10;
  float *src_10;
  longlong last_val_9;
  long *msk_9;
  longlong *dst_9;
  longlong *src_9;
  long last_val_8;
  long *msk_8;
  long *dst_8;
  long *src_8;
  int last_val_7;
  long *msk_7;
  int *dst_7;
  int *src_7;
  DoubleComplex last_val_6;
  int *msk_6;
  DoubleComplex *dst_6;
  DoubleComplex *src_6;
  SingleComplex last_val_5;
  int *msk_5;
  SingleComplex *dst_5;
  SingleComplex *src_5;
  double last_val_4;
  int *msk_4;
  double *dst_4;
  double *src_4;
  float last_val_3;
  int *msk_3;
  float *dst_3;
  float *src_3;
  longlong last_val_2;
  int *msk_2;
  longlong *dst_2;
  longlong *src_2;
  long last_val_1;
  int *msk_1;
  long *dst_1;
  long *src_1;
  int last_val;
  int *msk;
  int *dst;
  int *src;
  Integer stop;
  Integer start;
  Integer rmt_idx;
  DoubleComplex *buf_6;
  SingleComplex *buf_5;
  double *buf_4;
  float *buf_3;
  longlong *buf_2;
  long *buf_1;
  int *buf;
  void *ptr_msk;
  void *ptr_dst;
  void *ptr_src;
  Integer combined_type;
  Integer type_msk;
  Integer type_dst;
  Integer type_src;
  Integer ld;
  Integer dims;
  Integer ndim;
  Integer hip;
  Integer lop;
  Integer ioff;
  Integer elems;
  Integer me;
  Integer nproc;
  Integer i;
  long *lim;
  char *in_stack_fffffffffffff880;
  char *in_stack_fffffffffffff888;
  Integer in_stack_fffffffffffff890;
  void *in_stack_fffffffffffff898;
  Integer in_stack_fffffffffffff8a0;
  undefined8 uVar4;
  undefined8 local_758;
  undefined4 local_738;
  undefined4 local_734;
  undefined8 local_718;
  undefined4 local_6f4;
  undefined8 local_6d8;
  undefined8 local_6b8;
  undefined4 local_694;
  undefined8 local_678;
  undefined8 local_670;
  undefined4 local_650;
  undefined4 local_64c;
  undefined8 local_630;
  undefined4 local_60c;
  undefined8 local_5f0;
  Integer in_stack_fffffffffffffa18;
  long lVar5;
  char *in_stack_fffffffffffffa20;
  long lVar6;
  Integer *in_stack_fffffffffffffa30;
  void *in_stack_fffffffffffffa38;
  Integer *in_stack_fffffffffffffa40;
  Integer *in_stack_fffffffffffffa48;
  uint in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  undefined8 local_590;
  char *in_stack_fffffffffffffa78;
  Integer in_stack_fffffffffffffa80;
  Integer *in_stack_fffffffffffffa88;
  Integer *in_stack_fffffffffffffa90;
  long lVar7;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  Integer in_stack_fffffffffffffaa0;
  undefined8 local_548;
  undefined4 local_524;
  undefined8 local_508;
  undefined8 local_4e8;
  undefined4 local_4c4;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined4 local_480;
  undefined4 local_47c;
  Integer *in_stack_fffffffffffffb88;
  Integer *in_stack_fffffffffffffb90;
  Integer in_stack_fffffffffffffb98;
  Integer in_stack_fffffffffffffba0;
  undefined4 local_43c;
  undefined8 local_420;
  undefined8 local_400;
  undefined4 local_3dc;
  undefined8 local_3c0;
  undefined8 local_3b8;
  Integer *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 uVar9;
  Integer *in_stack_fffffffffffffc70;
  Integer *in_stack_fffffffffffffc78;
  Integer in_stack_fffffffffffffc80;
  undefined8 local_378;
  Integer in_stack_fffffffffffffc90;
  Integer in_stack_fffffffffffffc98;
  undefined4 local_354;
  undefined8 local_338;
  undefined8 local_318;
  undefined4 local_2f4;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined8 local_290;
  undefined4 local_26c;
  undefined8 local_250;
  undefined8 local_230;
  undefined4 local_20c;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined8 local_1a8;
  undefined4 local_184;
  undefined8 local_168;
  undefined8 local_148;
  undefined4 local_124;
  long local_108;
  long local_100;
  long local_f8;
  long local_98;
  long local_90;
  long local_88;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  Integer local_48;
  Integer local_40;
  long local_38;
  void *local_30;
  long local_28;
  long local_20;
  Integer local_18;
  long local_10;
  long local_8;
  
  local_30 = (void *)0x0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = pnga_nnodes();
  local_48 = pnga_nodeid();
  pnga_check_handle(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  pnga_check_handle(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  pnga_check_handle(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  lVar3 = pnga_compare_distr(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  if (lVar3 == 0) {
    pnga_error(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  lVar3 = pnga_compare_distr(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  if (lVar3 == 0) {
    pnga_error(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  pnga_inquire(in_stack_fffffffffffffaa0,
               (Integer *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  pnga_inquire(in_stack_fffffffffffffaa0,
               (Integer *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  pnga_inquire(in_stack_fffffffffffffaa0,
               (Integer *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  if (1 < local_70) {
    pnga_error(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  if (local_8 == local_10) {
    pnga_error(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  if (local_88 != local_90) {
    pnga_error(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  pnga_sync();
  pnga_distribution(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                    in_stack_fffffffffffffb88);
  local_30 = pnga_malloc(in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                         in_stack_fffffffffffff880);
  memset(local_30,0,local_40 << 3);
  *(undefined8 *)((long)local_30 + local_48 * 8) = 0xffffffffffffffff;
  if (0 < local_60) {
    local_50 = (local_68 - local_60) + 1;
    pnga_access_ptr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                    (void *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    in_stack_fffffffffffffc60);
    in_stack_fffffffffffff898 = (void *)(local_98 + -0x3e9);
    switch(in_stack_fffffffffffff898) {
    case (void *)0x0:
      for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
        if (((*(int *)(local_38 * 4) != 0) && (local_58 = local_38 + local_60, local_20 <= local_58)
            ) && (local_58 <= local_28)) {
          *(long *)((long)local_30 + local_48 * 8) = local_58;
        }
      }
      break;
    case (void *)0x1:
      for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
        if (((*(long *)(local_38 * 8) != 0) &&
            (local_58 = local_38 + local_60, local_20 <= local_58)) && (local_58 <= local_28)) {
          *(long *)((long)local_30 + local_48 * 8) = local_58;
        }
      }
      break;
    case (void *)0x2:
      for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
        if ((((*(float *)(local_38 * 4) != 0.0) || (NAN(*(float *)(local_38 * 4)))) &&
            (local_58 = local_38 + local_60, local_20 <= local_58)) && (local_58 <= local_28)) {
          *(long *)((long)local_30 + local_48 * 8) = local_58;
        }
      }
      break;
    case (void *)0x3:
      for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
        if (((*(double *)(local_38 * 8) != 0.0) || (NAN(*(double *)(local_38 * 8)))) &&
           ((local_58 = local_38 + local_60, local_20 <= local_58 && (local_58 <= local_28)))) {
          *(long *)((long)local_30 + local_48 * 8) = local_58;
        }
      }
      break;
    case (void *)0x5:
      for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
        if (((((*(float *)(local_38 * 8) != 0.0) || (NAN(*(float *)(local_38 * 8)))) ||
             (pfVar2 = (float *)(local_38 * 8 + 4), *pfVar2 != 0.0)) || (NAN(*pfVar2))) &&
           ((local_58 = local_38 + local_60, local_20 <= local_58 && (local_58 <= local_28)))) {
          *(long *)((long)local_30 + local_48 * 8) = local_58;
        }
      }
      break;
    case (void *)0x6:
      for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
        if ((((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
            ((pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0 || (NAN(*pdVar1))))) &&
           ((local_58 = local_38 + local_60, local_20 <= local_58 && (local_58 <= local_28)))) {
          *(long *)((long)local_30 + local_48 * 8) = local_58;
        }
      }
      break;
    case (void *)0xf:
      for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
        if (((*(long *)(local_38 * 8) != 0) &&
            (local_58 = local_38 + local_60, local_20 <= local_58)) && (local_58 <= local_28)) {
          *(long *)((long)local_30 + local_48 * 8) = local_58;
        }
      }
    }
    pnga_release(local_18,&local_60,&local_68);
  }
  pnga_gop(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
           in_stack_fffffffffffff888);
  if ((local_60 <= local_28) && (local_20 <= local_68)) {
    if (local_60 < local_20) {
      local_100 = local_20 - local_60;
    }
    else {
      local_100 = 0;
    }
    if (local_28 < local_68) {
      local_28 = local_28 - local_60;
    }
    else {
      local_28 = local_68 - local_60;
    }
    local_108 = local_28 + 1;
    local_f8 = -1;
    for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
      if (((*(long *)((long)local_30 + local_38 * 8) != -1) &&
          (local_f8 < *(long *)((long)local_30 + local_38 * 8))) &&
         (*(long *)((long)local_30 + local_38 * 8) < local_60)) {
        local_f8 = *(long *)((long)local_30 + local_38 * 8);
      }
    }
    pnga_access_ptr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                    (void *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    in_stack_fffffffffffffc60);
    pnga_access_ptr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                    (void *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    in_stack_fffffffffffffc60);
    pnga_access_ptr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                    (void *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    in_stack_fffffffffffffc60);
    switch(local_88 * 0x11 + local_98) {
    case 0x4662:
      local_124 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(int *)(local_38 * 4) != 0) {
          local_124 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_124;
      }
      break;
    case 0x4663:
      local_20c = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_20c = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_20c;
      }
      break;
    case 0x4664:
      local_3dc = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(float *)(local_38 * 4) != 0.0) || (NAN(*(float *)(local_38 * 4)))) {
          local_3dc = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_3dc;
      }
      break;
    case 0x4665:
      local_4c4 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(double *)(local_38 * 8) != 0.0) || (NAN(*(double *)(local_38 * 8)))) {
          local_4c4 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_4c4;
      }
      break;
    default:
      pnga_error(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      break;
    case 0x4667:
      uVar8 = 0;
      if (local_f8 != -1) {
        pnga_get((ulong)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (((*(float *)(local_38 * 8) != 0.0) || (NAN(*(float *)(local_38 * 8)))) ||
           ((pfVar2 = (float *)(local_38 * 8 + 4), *pfVar2 != 0.0 || (NAN(*pfVar2))))) {
          uVar8 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = uVar8;
      }
      break;
    case 0x4668:
      local_694 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
            (pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0)) || (NAN(*pdVar1))) {
          local_694 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_694;
      }
      break;
    case 0x4671:
      local_2f4 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_2f4 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_2f4;
      }
      break;
    case 0x4673:
      local_148 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(int *)(local_38 * 4) != 0) {
          local_148 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_148;
      }
      break;
    case 0x4674:
      local_230 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_230 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_230;
      }
      break;
    case 0x4675:
      local_400 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(float *)(local_38 * 4) != 0.0) || (NAN(*(float *)(local_38 * 4)))) {
          local_400 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_400;
      }
      break;
    case 0x4676:
      local_4e8 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(double *)(local_38 * 8) != 0.0) || (NAN(*(double *)(local_38 * 8)))) {
          local_4e8 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_4e8;
      }
      break;
    case 0x4678:
      lVar7 = 0;
      lVar6 = 0;
      lVar5 = 0;
      uVar4 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),(Integer *)0x0,
                 (Integer *)0x0,(void *)0x0,(Integer *)0x0);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        pfVar2 = (float *)(lVar5 + local_38 * 8);
        if (((*pfVar2 != 0.0) || (NAN(*pfVar2))) ||
           ((pfVar2 = (float *)(lVar5 + 4 + local_38 * 8), *pfVar2 != 0.0 || (NAN(*pfVar2))))) {
          uVar4 = *(undefined8 *)(lVar7 + local_38 * 8);
        }
        *(undefined8 *)(lVar6 + local_38 * 8) = uVar4;
      }
      break;
    case 0x4679:
      local_6b8 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
            (pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0)) || (NAN(*pdVar1))) {
          local_6b8 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_6b8;
      }
      break;
    case 0x4682:
      local_318 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_318 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_318;
      }
      break;
    case 0x4684:
      local_184 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(int *)(local_38 * 4) != 0) {
          local_184 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_184;
      }
      break;
    case 0x4685:
      local_26c = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_26c = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_26c;
      }
      break;
    case 0x4686:
      local_43c = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(float *)(local_38 * 4) != 0.0) || (NAN(*(float *)(local_38 * 4)))) {
          local_43c = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_43c;
      }
      break;
    case 0x4687:
      local_524 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(double *)(local_38 * 8) != 0.0) || (NAN(*(double *)(local_38 * 8)))) {
          local_524 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_524;
      }
      break;
    case 0x4689:
      local_60c = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (((*(float *)(local_38 * 8) != 0.0) || (NAN(*(float *)(local_38 * 8)))) ||
           ((pfVar2 = (float *)(local_38 * 8 + 4), *pfVar2 != 0.0 || (NAN(*pfVar2))))) {
          local_60c = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_60c;
      }
      break;
    case 0x468a:
      local_6f4 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
            (pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0)) || (NAN(*pdVar1))) {
          local_6f4 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_6f4;
      }
      break;
    case 0x4693:
      local_354 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_354 = *(undefined4 *)(local_38 * 4);
        }
        *(undefined4 *)(local_38 * 4) = local_354;
      }
      break;
    case 0x4695:
      local_1a8 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(int *)(local_38 * 4) != 0) {
          local_1a8 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_1a8;
      }
      break;
    case 0x4696:
      local_290 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_290 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_290;
      }
      break;
    case 0x4697:
      uVar4 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(float *)(local_38 * 4) != 0.0) || (NAN(*(float *)(local_38 * 4)))) {
          uVar4 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = uVar4;
      }
      break;
    case 0x4698:
      local_548 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(double *)(local_38 * 8) != 0.0) || (NAN(*(double *)(local_38 * 8)))) {
          local_548 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_548;
      }
      break;
    case 0x469a:
      local_630 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (((*(float *)(local_38 * 8) != 0.0) || (NAN(*(float *)(local_38 * 8)))) ||
           ((pfVar2 = (float *)(local_38 * 8 + 4), *pfVar2 != 0.0 || (NAN(*pfVar2))))) {
          local_630 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_630;
      }
      break;
    case 0x469b:
      local_718 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
            (pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0)) || (NAN(*pdVar1))) {
          local_718 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_718;
      }
      break;
    case 0x46a4:
      lVar6 = 0;
      lVar5 = 0;
      local_378 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(lVar5 + local_38 * 8) != 0) {
          local_378 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(lVar6 + local_38 * 8) = local_378;
      }
      break;
    case 0x46b7:
      local_1c8 = 0;
      local_1c4 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(int *)(local_38 * 4) != 0) {
          local_1c8 = *(undefined4 *)(local_38 * 8);
          local_1c4 = *(undefined4 *)(local_38 * 8 + 4);
        }
        *(undefined4 *)(local_38 * 8) = local_1c8;
        *(undefined4 *)(local_38 * 8 + 4) = local_1c4;
      }
      break;
    case 0x46b8:
      local_2b0 = 0;
      local_2ac = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_2b0 = *(undefined4 *)(local_38 * 8);
          local_2ac = *(undefined4 *)(local_38 * 8 + 4);
        }
        *(undefined4 *)(local_38 * 8) = local_2b0;
        *(undefined4 *)(local_38 * 8 + 4) = local_2ac;
      }
      break;
    case 0x46b9:
      lVar7 = 0;
      lVar6 = 0;
      lVar5 = 0;
      local_480 = 0;
      local_47c = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        pfVar2 = (float *)(lVar5 + local_38 * 4);
        if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
          local_480 = *(undefined4 *)(lVar7 + local_38 * 8);
          local_47c = *(undefined4 *)(lVar7 + 4 + local_38 * 8);
        }
        *(undefined4 *)(lVar6 + local_38 * 8) = local_480;
        *(undefined4 *)(lVar6 + 4 + local_38 * 8) = local_47c;
      }
      break;
    case 0x46ba:
      lVar5 = 0;
      uVar8 = 0;
      uVar9 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        pdVar1 = (double *)(lVar5 + local_38 * 8);
        if ((*pdVar1 != 0.0) || (NAN(*pdVar1))) {
          uVar8 = *(undefined4 *)(local_38 * 8);
          uVar9 = *(undefined4 *)(local_38 * 8 + 4);
        }
        *(undefined4 *)(local_38 * 8) = uVar8;
        *(undefined4 *)(local_38 * 8 + 4) = uVar9;
      }
      break;
    case 0x46bc:
      local_650 = 0;
      local_64c = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (((*(float *)(local_38 * 8) != 0.0) || (NAN(*(float *)(local_38 * 8)))) ||
           ((pfVar2 = (float *)(local_38 * 8 + 4), *pfVar2 != 0.0 || (NAN(*pfVar2))))) {
          local_650 = *(undefined4 *)(local_38 * 8);
          local_64c = *(undefined4 *)(local_38 * 8 + 4);
        }
        *(undefined4 *)(local_38 * 8) = local_650;
        *(undefined4 *)(local_38 * 8 + 4) = local_64c;
      }
      break;
    case 0x46bd:
      local_738 = 0;
      local_734 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
            (pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0)) || (NAN(*pdVar1))) {
          local_738 = *(undefined4 *)(local_38 * 8);
          local_734 = *(undefined4 *)(local_38 * 8 + 4);
        }
        *(undefined4 *)(local_38 * 8) = local_738;
        *(undefined4 *)(local_38 * 8 + 4) = local_734;
      }
      break;
    case 0x46c6:
      lVar7 = 0;
      lVar6 = 0;
      lVar5 = 0;
      uVar8 = 0;
      uVar9 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(lVar5 + local_38 * 8) != 0) {
          uVar8 = *(undefined4 *)(lVar7 + local_38 * 8);
          uVar9 = *(undefined4 *)(lVar7 + 4 + local_38 * 8);
        }
        *(undefined4 *)(lVar6 + local_38 * 8) = uVar8;
        *(undefined4 *)(lVar6 + 4 + local_38 * 8) = uVar9;
      }
      break;
    case 0x46c8:
      local_1f0 = 0;
      local_1e8 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(int *)(local_38 * 4) != 0) {
          local_1f0 = *(undefined8 *)(local_38 * 0x10);
          local_1e8 = *(undefined8 *)(local_38 * 0x10 + 8);
        }
        *(undefined8 *)(local_38 * 0x10) = local_1f0;
        *(undefined8 *)(local_38 * 0x10 + 8) = local_1e8;
      }
      break;
    case 0x46c9:
      local_2d8 = 0;
      local_2d0 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_2d8 = *(undefined8 *)(local_38 * 0x10);
          local_2d0 = *(undefined8 *)(local_38 * 0x10 + 8);
        }
        *(undefined8 *)(local_38 * 0x10) = local_2d8;
        *(undefined8 *)(local_38 * 0x10 + 8) = local_2d0;
      }
      break;
    case 0x46ca:
      local_4a8 = 0;
      local_4a0 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(float *)(local_38 * 4) != 0.0) || (NAN(*(float *)(local_38 * 4)))) {
          local_4a8 = *(undefined8 *)(local_38 * 0x10);
          local_4a0 = *(undefined8 *)(local_38 * 0x10 + 8);
        }
        *(undefined8 *)(local_38 * 0x10) = local_4a8;
        *(undefined8 *)(local_38 * 0x10 + 8) = local_4a0;
      }
      break;
    case 0x46cb:
      lVar7 = 0;
      lVar6 = 0;
      lVar5 = 0;
      local_590 = 0;
      uVar4 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        pdVar1 = (double *)(lVar5 + local_38 * 8);
        if ((*pdVar1 != 0.0) || (NAN(*pdVar1))) {
          local_590 = *(undefined8 *)(lVar7 + local_38 * 0x10);
          uVar4 = *(undefined8 *)(lVar7 + local_38 * 0x10 + 8);
        }
        *(undefined8 *)(lVar6 + local_38 * 0x10) = local_590;
        *(undefined8 *)(lVar6 + local_38 * 0x10 + 8) = uVar4;
      }
      break;
    case 0x46cd:
      local_678 = 0;
      local_670 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (((*(float *)(local_38 * 8) != 0.0) || (NAN(*(float *)(local_38 * 8)))) ||
           ((pfVar2 = (float *)(local_38 * 8 + 4), *pfVar2 != 0.0 || (NAN(*pfVar2))))) {
          local_678 = *(undefined8 *)(local_38 * 0x10);
          local_670 = *(undefined8 *)(local_38 * 0x10 + 8);
        }
        *(undefined8 *)(local_38 * 0x10) = local_678;
        *(undefined8 *)(local_38 * 0x10 + 8) = local_670;
      }
      break;
    case 0x46ce:
      uVar4 = 0;
      local_758 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
            (pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0)) || (NAN(*pdVar1))) {
          uVar4 = *(undefined8 *)(local_38 * 0x10);
          local_758 = *(undefined8 *)(local_38 * 0x10 + 8);
        }
        *(undefined8 *)(local_38 * 0x10) = uVar4;
        *(undefined8 *)(local_38 * 0x10 + 8) = local_758;
      }
      break;
    case 0x46d7:
      lVar5 = 0;
      local_3c0 = 0;
      local_3b8 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_3c0 = *(undefined8 *)(lVar5 + local_38 * 0x10);
          local_3b8 = *(undefined8 *)(lVar5 + local_38 * 0x10 + 8);
        }
        *(undefined8 *)(local_38 * 0x10) = local_3c0;
        *(undefined8 *)(local_38 * 0x10 + 8) = local_3b8;
      }
      break;
    case 0x4761:
      local_168 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(int *)(local_38 * 4) != 0) {
          local_168 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_168;
      }
      break;
    case 0x4762:
      local_250 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_250 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_250;
      }
      break;
    case 0x4763:
      local_420 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(float *)(local_38 * 4) != 0.0) || (NAN(*(float *)(local_38 * 4)))) {
          local_420 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_420;
      }
      break;
    case 0x4764:
      local_508 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if ((*(double *)(local_38 * 8) != 0.0) || (NAN(*(double *)(local_38 * 8)))) {
          local_508 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_508;
      }
      break;
    case 0x4766:
      lVar6 = 0;
      lVar5 = 0;
      local_5f0 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        pfVar2 = (float *)(lVar5 + local_38 * 8);
        if (((*pfVar2 != 0.0) || (NAN(*pfVar2))) ||
           ((pfVar2 = (float *)(lVar5 + 4 + local_38 * 8), *pfVar2 != 0.0 || (NAN(*pfVar2))))) {
          local_5f0 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(lVar6 + local_38 * 8) = local_5f0;
      }
      break;
    case 0x4767:
      local_6d8 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (((*(double *)(local_38 * 0x10) != 0.0) || (NAN(*(double *)(local_38 * 0x10)))) ||
           ((pdVar1 = (double *)(local_38 * 0x10 + 8), *pdVar1 != 0.0 || (NAN(*pdVar1))))) {
          local_6d8 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_6d8;
      }
      break;
    case 0x4770:
      local_338 = 0;
      if (local_f8 != -1) {
        pnga_get(CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30);
      }
      for (local_38 = local_100; local_38 < local_108; local_38 = local_38 + 1) {
        if (*(long *)(local_38 * 8) != 0) {
          local_338 = *(undefined8 *)(local_38 * 8);
        }
        *(undefined8 *)(local_38 * 8) = local_338;
      }
    }
    pnga_release(local_8,&local_60,&local_68);
    pnga_release(local_18,&local_60,&local_68);
    pnga_release_update(local_10,&local_60,&local_68);
  }
  pnga_sync();
  pnga_free((void *)0x15b8a7);
  return;
}

Assistant:

void pnga_scan_copy(Integer g_src, Integer g_dst, Integer g_msk,
                           Integer lo, Integer hi)
{       
    long *lim=NULL;
    Integer i, nproc, me, elems, ioff, lop, hip, ndim, dims, ld;
    Integer type_src, type_dst, type_msk, combined_type;
    void *ptr_src=NULL;
    void *ptr_dst=NULL;
    void *ptr_msk=NULL;

    nproc = pnga_nnodes();
    me = pnga_nodeid();

    pnga_check_handle(g_src, "ga_scan_copy 1");
    pnga_check_handle(g_dst, "ga_scan_copy 2");
    pnga_check_handle(g_msk, "ga_scan_copy 3");

    if(!pnga_compare_distr(g_src, g_msk))
        pnga_error("ga_scan_copy: different distribution src",0);
    if(!pnga_compare_distr(g_dst, g_msk))
        pnga_error("ga_scan_copy: different distribution dst",0);

    pnga_inquire(g_src, &type_src, &ndim, &dims);
    pnga_inquire(g_dst, &type_dst, &ndim, &dims);
    pnga_inquire(g_msk, &type_msk, &ndim, &dims);
    if(ndim>1)pnga_error("ga_scan_copy: applicable to 1-dim arrays",ndim);
    if(g_src == g_dst) {
        pnga_error("ga_scan_copy: src and dst must be different arrays", 0);
    }
    if(type_src != type_dst) {
        pnga_error("ga_scan_copy: src and dst arrays must be same type", 0);
    }

    pnga_sync();

    pnga_distribution(g_msk, me, &lop, &hip);

    /* create arrays to hold last bit set on a given process */
    lim = (long *) pnga_malloc(nproc, MT_C_LONGINT, "ga scan buf");
    bzero(lim,sizeof(long)*nproc);
    lim[me] = -1;

    /* find last bit set on given process (store as global index) */
    if ( lop > 0 ){ /* we get 0 if no elements stored on this process */ 
        elems = hip - lop + 1;
        pnga_access_ptr(g_msk, &lop, &hip, &ptr_msk, &ld);
        switch (type_msk) {
#define TYPE_CASE(MT,T,AT)                                      \
            case MT:                                            \
                {                                               \
                    T * restrict buf = (T*)ptr_msk;             \
                    for(i=0; i<elems; i++) {                    \
                        if (neq_zero_##AT(buf[i])) {            \
                            ioff = i + lop;                     \
                            if (ioff >= lo && ioff <= hi) {     \
                                lim[me]= ioff;                  \
                            }                                   \
                        }                                       \
                    }                                           \
                    break;                                      \
                }
#include "types.xh"
#undef TYPE_CASE
        }
        pnga_release(g_msk, &lop, &hip);
    }
    pnga_gop(C_LONG,lim,nproc,"+");

    if(hi <lop || hip <lo) {
        /* we have no elements to update */
    }
    else {
        Integer rmt_idx, start, stop;

        if (lop < lo) {
            start = lo - lop;
        } else {
            start = 0;
        }
        if (hip > hi) {
            stop = hi-lop+1;
        } else {
            stop = hip-lop+1;
        }

        /* If start bit is not first local bit, find last remote bit.
         * We must scan the entire lim to find the next-highest index.
         * Otherwise, this algorithm won't work with restricted arrays? */
        rmt_idx = -1;
        for (i=0; i<nproc; i++) {
            if (-1 != lim[i] && lim[i] > rmt_idx && lim[i] < lop) {
                rmt_idx = lim[i];
            }
        }

        pnga_access_ptr(g_src, &lop, &hip, &ptr_src, &ld);
        pnga_access_ptr(g_dst, &lop, &hip, &ptr_dst, &ld);
        pnga_access_ptr(g_msk, &lop, &hip, &ptr_msk, &ld);
        combined_type = MT_NUMTYPES*type_src + type_msk;
        switch (combined_type) {
#define TYPE_CASE(MT,T,AT,MT_MSK,T_MSK,AT_MSK)                              \
            case (MT_NUMTYPES*MT) + MT_MSK:                                 \
                {                                                           \
                    T * restrict src = (T*)ptr_src;                         \
                    T * restrict dst = (T*)ptr_dst;                         \
                    T_MSK * restrict msk = (T_MSK*)ptr_msk;                 \
                    T last_val;                                             \
                    assign_zero_##AT(last_val);                             \
                    if (-1 != rmt_idx) {                                    \
                        pnga_get(g_src, &rmt_idx, &rmt_idx, &last_val, &ld);\
                    }                                                       \
                    for (i=start; i<stop; i++) {                            \
                        if (neq_zero_##AT_MSK(msk[i])) {                    \
                            assign_##AT(last_val, src[i]);                  \
                        }                                                   \
                        assign_##AT(dst[i], last_val);                      \
                    }                                                       \
                    break;                                                  \
                }
#include "types2.xh"
#undef TYPE_CASE
            default: pnga_error("ga_scan_copy:wrong data type",combined_type);
        }
        /* release local access to arrays */
        pnga_release(g_src, &lop, &hip);
        pnga_release(g_msk, &lop, &hip);
        pnga_release_update(g_dst, &lop, &hip);
    }

    pnga_sync();
    pnga_free(lim);
}